

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFindPackageCommand::CheckVersionFile
          (cmFindPackageCommand *this,string *version_file,string *result_version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  uint parsed_major;
  char buf [64];
  uint parsed_tweak;
  uint parsed_patch;
  uint parsed_minor;
  PolicyPushPop polScope;
  string local_b8;
  string local_98 [2];
  uint local_4c;
  uint local_48;
  uint local_44;
  cmMakefile *local_40;
  PolicyPushPop local_38;
  
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  cmMakefile::PushScope(pcVar2);
  local_40 = pcVar2;
  cmMakefile::PolicyPushPop::PolicyPushPop
            (&local_38,(this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  paVar1 = &local_98[0].field_2;
  local_98[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"PACKAGE_VERSION","");
  cmMakefile::RemoveDefinition(pcVar2,local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_98[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"PACKAGE_VERSION_UNSUITABLE","");
  cmMakefile::RemoveDefinition(pcVar2,local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_98[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"PACKAGE_VERSION_COMPATIBLE","");
  cmMakefile::RemoveDefinition(pcVar2,local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_98[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"PACKAGE_VERSION_EXACT","");
  cmMakefile::RemoveDefinition(pcVar2,local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_98[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"PACKAGE_FIND_NAME","");
  cmMakefile::AddDefinition(pcVar2,local_98,(this->Name)._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_98[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"PACKAGE_FIND_VERSION","");
  cmMakefile::AddDefinition(pcVar2,local_98,(this->Version)._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  sprintf((char *)local_98,"%u",(ulong)this->VersionMajor);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"PACKAGE_FIND_VERSION_MAJOR","");
  cmMakefile::AddDefinition(pcVar2,&local_b8,(char *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  sprintf((char *)local_98,"%u",(ulong)this->VersionMinor);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"PACKAGE_FIND_VERSION_MINOR","");
  cmMakefile::AddDefinition(pcVar2,&local_b8,(char *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  sprintf((char *)local_98,"%u",(ulong)this->VersionPatch);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"PACKAGE_FIND_VERSION_PATCH","");
  cmMakefile::AddDefinition(pcVar2,&local_b8,(char *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  sprintf((char *)local_98,"%u",(ulong)this->VersionTweak);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"PACKAGE_FIND_VERSION_TWEAK","");
  cmMakefile::AddDefinition(pcVar2,&local_b8,(char *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  sprintf((char *)local_98,"%u",(ulong)this->VersionCount);
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"PACKAGE_FIND_VERSION_COUNT","");
  cmMakefile::AddDefinition(pcVar2,&local_b8,(char *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  bVar4 = ReadListFile(this,(version_file->_M_dataplus)._M_p,NoPolicyScope);
  if (bVar4) {
    pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"PACKAGE_VERSION_EXACT","");
    bVar4 = cmMakefile::IsOn(pcVar2,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"PACKAGE_VERSION_UNSUITABLE","");
    bVar5 = cmMakefile::IsOn(pcVar2,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
LAB_002e4116:
      if (bVar5) goto LAB_002e420c;
    }
    else {
      if (this->VersionExact == false) {
        pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"PACKAGE_VERSION_COMPATIBLE","");
        bVar4 = cmMakefile::IsOn(pcVar2,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4 != false || bVar5) goto LAB_002e4116;
      if ((this->Version)._M_string_length != 0) goto LAB_002e420c;
    }
    pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"PACKAGE_VERSION","");
    pcVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_b8);
    pcVar3 = (char *)(this->VersionFound)._M_string_length;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&this->VersionFound,0,pcVar3,(ulong)pcVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    uVar6 = __isoc99_sscanf((this->VersionFound)._M_dataplus._M_p,"%u.%u.%u.%u",&local_b8,&local_44,
                            &local_48,&local_4c);
    this->VersionFoundCount = uVar6;
    switch(uVar6) {
    case 4:
      this->VersionFoundTweak = local_4c;
    case 3:
      this->VersionFoundPatch = local_48;
    case 2:
      this->VersionFoundMinor = local_44;
    case 1:
      this->VersionFoundMajor = (uint)local_b8._M_dataplus._M_p;
    default:
      bVar4 = true;
    }
  }
  else {
LAB_002e420c:
    bVar4 = false;
  }
  pcVar2 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"PACKAGE_VERSION","");
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_b8);
  pcVar3 = (char *)result_version->_M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)result_version,0,pcVar3,(ulong)pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (result_version->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)result_version,0,(char *)0x0,0x50b919);
  }
  cmMakefile::PolicyPushPop::~PolicyPushPop(&local_38);
  cmMakefile::PopScope(local_40);
  return bVar4;
}

Assistant:

bool cmFindPackageCommand::CheckVersionFile(std::string const& version_file,
                                            std::string& result_version)
{
  // The version file will be loaded in an isolated scope.
  cmMakefile::ScopePushPop varScope(this->Makefile);
  cmMakefile::PolicyPushPop polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  // Clear the output variables.
  this->Makefile->RemoveDefinition("PACKAGE_VERSION");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_UNSUITABLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_COMPATIBLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_EXACT");

  // Set the input variables.
  this->Makefile->AddDefinition("PACKAGE_FIND_NAME", this->Name.c_str());
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION",
                                this->Version.c_str());
  char buf[64];
  sprintf(buf, "%u", this->VersionMajor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MAJOR", buf);
  sprintf(buf, "%u", this->VersionMinor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MINOR", buf);
  sprintf(buf, "%u", this->VersionPatch);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_PATCH", buf);
  sprintf(buf, "%u", this->VersionTweak);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_TWEAK", buf);
  sprintf(buf, "%u", this->VersionCount);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_COUNT", buf);

  // Load the version check file.  Pass NoPolicyScope because we do
  // our own policy push/pop independent of CMP0011.
  bool suitable = false;
  if(this->ReadListFile(version_file.c_str(), NoPolicyScope))
    {
    // Check the output variables.
    bool okay = this->Makefile->IsOn("PACKAGE_VERSION_EXACT");
    bool unsuitable = this->Makefile->IsOn("PACKAGE_VERSION_UNSUITABLE");
    if(!okay && !this->VersionExact)
      {
      okay = this->Makefile->IsOn("PACKAGE_VERSION_COMPATIBLE");
      }

    // The package is suitable if the version is okay and not
    // explicitly unsuitable.
    suitable = !unsuitable && (okay || this->Version.empty());
    if(suitable)
      {
      // Get the version found.
      this->VersionFound =
        this->Makefile->GetSafeDefinition("PACKAGE_VERSION");

      // Try to parse the version number and store the results that were
      // successfully parsed.
      unsigned int parsed_major;
      unsigned int parsed_minor;
      unsigned int parsed_patch;
      unsigned int parsed_tweak;
      this->VersionFoundCount =
        sscanf(this->VersionFound.c_str(), "%u.%u.%u.%u",
               &parsed_major, &parsed_minor,
               &parsed_patch, &parsed_tweak);
      switch(this->VersionFoundCount)
        {
        case 4: this->VersionFoundTweak = parsed_tweak; // no break!
        case 3: this->VersionFoundPatch = parsed_patch; // no break!
        case 2: this->VersionFoundMinor = parsed_minor; // no break!
        case 1: this->VersionFoundMajor = parsed_major; // no break!
        default: break;
        }
      }
    }

  result_version = this->Makefile->GetSafeDefinition("PACKAGE_VERSION");
  if (result_version.empty())
    {
    result_version = "unknown";
    }

  // Succeed if the version is suitable.
  return suitable;
}